

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_security.c
# Opt level: O0

int overflow2(int a,int b)

{
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    gd_error_ex(4,
                "one parameter to a memory allocation multiplication is negative or zero, failing operation gracefully\n"
               );
    b_local = 1;
  }
  else if ((int)(0x7fffffff / (long)b) < a) {
    gd_error_ex(4,
                "product of memory allocation multiplication would exceed INT_MAX, failing operation gracefully\n"
                ,0x7fffffff % (long)b & 0xffffffff);
    b_local = 1;
  }
  else {
    b_local = 0;
  }
  return b_local;
}

Assistant:

int overflow2(int a, int b)
{
	if(a <= 0 || b <= 0) {
		gd_error_ex(GD_WARNING, "one parameter to a memory allocation multiplication is negative or zero, failing operation gracefully\n");
		return 1;
	}
	if(a > INT_MAX / b) {
		gd_error_ex(GD_WARNING, "product of memory allocation multiplication would exceed INT_MAX, failing operation gracefully\n");
		return 1;
	}
	return 0;
}